

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O3

SQInteger base_assert(HSQUIRRELVM v)

{
  bool bVar1;
  SQObjectPtr *o;
  SQInteger SVar2;
  SQRESULT SVar3;
  char *err;
  SQChar *str;
  SQChar *local_10;
  
  o = SQVM::GetAt(v,v->_stackbase + 1);
  bVar1 = SQVM::IsFalse(o);
  if (!bVar1) {
    return 0;
  }
  SVar2 = sq_gettop(v);
  if ((2 < SVar2) && (SVar3 = sq_tostring(v,3), -1 < SVar3)) {
    local_10 = (SQChar *)0x0;
    SVar3 = sq_getstring(v,-1,&local_10);
    err = local_10;
    if (-1 < SVar3) goto LAB_0012ca88;
  }
  err = "assertion failed";
LAB_0012ca88:
  SVar3 = sq_throwerror(v,err);
  return SVar3;
}

Assistant:

static SQInteger base_assert(HSQUIRRELVM v)
{
    if(SQVM::IsFalse(stack_get(v,2))){
        SQInteger top = sq_gettop(v);
        if (top>2 && SQ_SUCCEEDED(sq_tostring(v,3))) {
            const SQChar *str = 0;
            if (SQ_SUCCEEDED(sq_getstring(v,-1,&str))) {
                return sq_throwerror(v, str);
            }
        }
        return sq_throwerror(v, _SC("assertion failed"));
    }
    return 0;
}